

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawTestCaseUtil.hpp
# Opt level: O3

void __thiscall
vkt::Draw::
InstanceFactory<vkt::Draw::(anonymous_namespace)::IndirectDrawInstanced<vkt::Draw::(anonymous_namespace)::FirtsInstanceNotSupported>_>
::InstanceFactory(InstanceFactory<vkt::Draw::(anonymous_namespace)::IndirectDrawInstanced<vkt::Draw::(anonymous_namespace)::FirtsInstanceNotSupported>_>
                  *this,TestContext *testCtx,string *name,string *desc,TestSpec *testSpec)

{
  undefined4 uVar1;
  
  tcu::TestCase::TestCase((TestCase *)this,testCtx,(char *)name,(char *)desc);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__InstanceFactory_00d31d78;
  std::
  _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  ::_Rb_tree((_Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
              *)&this->m_testSpec,
             (_Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
              *)testSpec);
  uVar1 = *(undefined4 *)&(testSpec->super_TestSpecBase).field_0x34;
  (this->m_testSpec).super_TestSpecBase.topology = (testSpec->super_TestSpecBase).topology;
  *(undefined4 *)&(this->m_testSpec).super_TestSpecBase.field_0x34 = uVar1;
  return;
}

Assistant:

InstanceFactory (tcu::TestContext& testCtx, const std::string& name, const std::string& desc, typename Instance::TestSpec testSpec)
		: TestCase		(testCtx, name, desc)
		, m_testSpec	(testSpec)
	{
	}